

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

void __thiscall
BufferInputSource::BufferInputSource(BufferInputSource *this,string *description,string *contents)

{
  Buffer *this_00;
  size_t size;
  qpdf_offset_t qVar1;
  uchar *__dest;
  void *__src;
  size_t __n;
  size_t local_38 [3];
  string *local_20;
  string *contents_local;
  string *description_local;
  BufferInputSource *this_local;
  
  local_20 = contents;
  contents_local = description;
  description_local = (string *)this;
  InputSource::InputSource(&this->super_InputSource);
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_0058a8b0;
  this->own_memory = true;
  std::__cxx11::string::string((string *)&this->description,(string *)contents_local);
  this_00 = (Buffer *)operator_new(8);
  size = std::__cxx11::string::length();
  Buffer::Buffer(this_00,size);
  this->buf = this_00;
  this->cur_offset = 0;
  local_38[0] = Buffer::getSize(this->buf);
  qVar1 = QIntC::to_offset<unsigned_long>(local_38);
  this->max_offset = qVar1;
  __dest = Buffer::getBuffer(this->buf);
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

BufferInputSource::BufferInputSource(std::string const& description, std::string const& contents) :
    own_memory(true),
    description(description),
    buf(new Buffer(contents.length())),
    cur_offset(0),
    max_offset(QIntC::to_offset(buf->getSize()))
{
    memcpy(buf->getBuffer(), contents.c_str(), contents.length());
}